

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NodeRemoveNonCurrentObjects(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar4;
  long lVar5;
  
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar5];
      if (pObj != (Abc_Obj_t *)0x0) {
        pAVar2 = pObj->pNtk;
        iVar1 = pObj->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,(int)in_RDX);
        if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        in_RDX = extraout_RDX;
        if ((pAVar2->vTravIds).pArray[iVar1] != pObj->pNtk->nTravIds) {
          Abc_NtkDeleteObj(pObj);
          iVar4 = iVar4 + 1;
          in_RDX = extraout_RDX_00;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar4;
}

Assistant:

int Abc_NodeRemoveNonCurrentObjects( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int Counter, i;
    int fVerbose = 0;

    // report on the nodes to be deleted
    if ( fVerbose )
    {
        printf( "These nodes will be deleted: \n" );
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent( pObj ) )
            {
                printf( "    " );
                Abc_ObjPrint( stdout, pObj );
            }
    }
    
    // delete the nodes    
    Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent( pObj ) )
        {
            Abc_NtkDeleteObj( pObj );
            Counter++;
        }
    return Counter;
}